

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_user.cpp
# Opt level: O3

void P_CheckPlayerSprite(AActor *actor,int *spritenum,DVector2 *scale)

{
  double dVar1;
  player_t *ppVar2;
  FPlayerSkin *pFVar3;
  int iVar4;
  Node *pNVar5;
  undefined4 extraout_var;
  Node *pNVar7;
  Node *pNVar8;
  hash_t hVar9;
  ulong uVar10;
  int *piVar11;
  PClass *pPVar6;
  
  ppVar2 = actor->player;
  pNVar7 = (ppVar2->userinfo).
           super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>.Nodes;
  hVar9 = (ppVar2->userinfo).
          super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>.Size;
  uVar10 = (ulong)(hVar9 - 1 & 0x208);
  pNVar8 = pNVar7 + uVar10;
  do {
    pNVar5 = pNVar8;
    pNVar8 = pNVar5->Next;
  } while ((pNVar5->Pair).Key.Index != 0x208);
  if ((*(int *)&(pNVar5->Pair).Value[1]._vptr_FBaseCVar != 0) &&
     (((actor->flags4).Value & 0x20) == 0)) {
    pPVar6 = (actor->super_DThinker).super_DObject.Class;
    if (pPVar6 == (PClass *)0x0) {
      iVar4 = (**(actor->super_DThinker).super_DObject._vptr_DObject)(actor);
      pPVar6 = (PClass *)CONCAT44(extraout_var,iVar4);
      (actor->super_DThinker).super_DObject.Class = pPVar6;
      pNVar7 = (ppVar2->userinfo).
               super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>.Nodes;
      hVar9 = (ppVar2->userinfo).
              super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>.Size;
      uVar10 = (ulong)(hVar9 - 1 & 0x208);
    }
    pFVar3 = skins;
    dVar1 = *(double *)(pPVar6->Defaults + 0x100);
    pNVar8 = pNVar7 + uVar10;
    do {
      pNVar5 = pNVar8;
      pNVar8 = pNVar5->Next;
    } while ((pNVar5->Pair).Key.Index != 0x208);
    scale->X = (skins[*(int *)&(pNVar5->Pair).Value[1]._vptr_FBaseCVar].Scale.X /
               *(double *)(pPVar6->Defaults + 0xf8)) * scale->X;
    pNVar8 = pNVar7 + uVar10;
    do {
      pNVar5 = pNVar8;
      pNVar8 = pNVar5->Next;
    } while ((pNVar5->Pair).Key.Index != 0x208);
    scale->Y = (pFVar3[*(int *)&(pNVar5->Pair).Value[1]._vptr_FBaseCVar].Scale.Y / dVar1) * scale->Y
    ;
  }
  if (0.75 < ppVar2->crouchfactor || ppVar2->crouchfactor == 0.75) {
    return;
  }
  iVar4 = *spritenum;
  if ((iVar4 == actor->SpawnState->sprite) ||
     (iVar4 == *(int *)&(ppVar2->mo->super_AActor).field_0x4bc)) {
    piVar11 = (int *)&(ppVar2->mo->super_AActor).field_0x4bc;
  }
  else {
    if (((actor->flags4).Value & 0x20) != 0) goto LAB_00468bba;
    pNVar7 = pNVar7 + (hVar9 - 1 & 0x208);
    pNVar8 = pNVar7;
    do {
      pNVar5 = pNVar8;
      pNVar8 = pNVar5->Next;
    } while ((pNVar5->Pair).Key.Index != 0x208);
    pNVar8 = pNVar7;
    if (iVar4 != skins[*(int *)&(pNVar5->Pair).Value[1]._vptr_FBaseCVar].sprite) {
      do {
        pNVar5 = pNVar8;
        pNVar8 = pNVar5->Next;
      } while ((pNVar5->Pair).Key.Index != 0x208);
      if (iVar4 != skins[*(int *)&(pNVar5->Pair).Value[1]._vptr_FBaseCVar].crouchsprite)
      goto LAB_00468bba;
    }
    do {
      pNVar8 = pNVar7;
      pNVar7 = pNVar8->Next;
    } while ((pNVar8->Pair).Key.Index != 0x208);
    piVar11 = &skins[*(int *)&(pNVar8->Pair).Value[1]._vptr_FBaseCVar].crouchsprite;
  }
  if (0 < *piVar11) {
    *spritenum = *piVar11;
    return;
  }
LAB_00468bba:
  if (ppVar2->playerstate != '\x01') {
    scale->Y = scale->Y * 0.5;
  }
  return;
}

Assistant:

void P_CheckPlayerSprite(AActor *actor, int &spritenum, DVector2 &scale)
{
	player_t *player = actor->player;
	int crouchspriteno;

	if (player->userinfo.GetSkin() != 0 && !(actor->flags4 & MF4_NOSKIN))
	{
		// Convert from default scale to skin scale.
		DVector2 defscale = actor->GetDefault()->Scale;
		scale.X *= skins[player->userinfo.GetSkin()].Scale.X / defscale.X;
		scale.Y *= skins[player->userinfo.GetSkin()].Scale.Y / defscale.Y;
	}

	// Set the crouch sprite?
	if (player->crouchfactor < 0.75)
	{
		if (spritenum == actor->SpawnState->sprite || spritenum == player->mo->crouchsprite) 
		{
			crouchspriteno = player->mo->crouchsprite;
		}
		else if (!(actor->flags4 & MF4_NOSKIN) &&
				(spritenum == skins[player->userinfo.GetSkin()].sprite ||
				 spritenum == skins[player->userinfo.GetSkin()].crouchsprite))
		{
			crouchspriteno = skins[player->userinfo.GetSkin()].crouchsprite;
		}
		else
		{ // no sprite -> squash the existing one
			crouchspriteno = -1;
		}

		if (crouchspriteno > 0) 
		{
			spritenum = crouchspriteno;
		}
		else if (player->playerstate != PST_DEAD && player->crouchfactor < 0.75)
		{
			scale.Y *= 0.5;
		}
	}
}